

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_t.cpp
# Opt level: O2

void __thiscall deci::program_t::~program_t(program_t *this)

{
  pointer pcVar1;
  pointer pcVar2;
  
  (this->super_function_t).super_value_t._vptr_value_t = (_func_int **)&PTR_DoHashing_0010f610;
  (*this->result->_vptr_value_t[3])();
  pcVar1 = (this->source).super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pcVar2 = (this->source).super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>
                ._M_impl.super__Vector_impl_data._M_start; pcVar2 != pcVar1; pcVar2 = pcVar2 + 1) {
    (*pcVar2->arg->_vptr_value_t[3])();
  }
  std::_Vector_base<deci::command_t,_std::allocator<deci::command_t>_>::~_Vector_base
            (&(this->source).super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>);
  value_t::~value_t((value_t *)this);
  return;
}

Assistant:

program_t::~program_t() {
    result->Delete();
    for (auto command: this->source)
    {
      command.arg->Delete();
    }
  }